

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

TransactionError
node::BroadcastTransaction
          (NodeContext *node,CTransactionRef tx,string *err_string,CAmount *max_tx_fee,bool relay,
          bool wait_callback)

{
  long lVar1;
  element_type *peVar2;
  pointer pcVar3;
  ValidationSignals *this;
  PeerManager *pPVar4;
  function<void_()> func;
  bool bVar5;
  uint __line;
  TransactionError TVar6;
  Chainstate *this_00;
  CCoinsViewCache *this_01;
  Coin *pCVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> err_string_out;
  element_type *tx_00;
  promise<void> *__state;
  char *__assertion;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined7 in_register_00000089;
  size_t o;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  char cVar12;
  CTransactionRef mempool_tx;
  promise<void> promise;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  MempoolAcceptResult result;
  uint256 wtxid;
  Txid txid;
  
  err_string_out =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  tx_00 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar9 = (undefined4)CONCAT71(in_register_00000089,relay);
  uVar8 = SUB84(max_tx_fee,0);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((node->chainman)._M_t.
      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
      super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl == (ChainstateManager *)0x0) {
    __assertion = "node.chainman";
    __line = 0x27;
  }
  else if ((node->mempool)._M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>.
           _M_t.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl == (CTxMemPool *)0x0) {
    __assertion = "node.mempool";
    __line = 0x28;
  }
  else {
    if ((node->peerman)._M_t.super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>.
        _M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
        super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl != (PeerManager *)0x0) {
      std::promise<void>::promise(&promise);
      peVar2 = (element_type *)
               (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      wtxid.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      wtxid.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            ((peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      wtxid.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      wtxid.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((peVar2->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock18,&cs_main,"cs_main",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp"
                 ,0x31,false);
      this_00 = ChainstateManager::ActiveChainstate
                          ((node->chainman)._M_t.
                           super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                           .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
      this_01 = Chainstate::CoinsTip(this_00);
      uVar10 = 0;
      do {
        peVar2 = (element_type *)
                 (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_start) / 0x28) <= uVar10) {
          CTxMemPool::get((CTxMemPool *)&mempool_tx,
                          (uint256 *)
                          (node->mempool)._M_t.
                          super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
          if (mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              == (element_type *)0x0) {
            if ((long)(err_string->_M_dataplus)._M_p < 1) {
              TVar6 = ALREADY_IN_UTXO_SET;
            }
            else {
              ChainstateManager::ProcessTransaction
                        (&result,(node->chainman)._M_t.
                                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                         (CTransactionRef *)tx_00,true);
              if (result.m_result_type == VALID) {
                if (result.m_base_fees.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_engaged == false) {
                  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                    std::__throw_bad_optional_access();
                  }
                  goto LAB_007bc089;
                }
                pcVar3 = (err_string->_M_dataplus)._M_p;
                bVar11 = result.m_base_fees.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload._M_value <= (long)pcVar3;
                TVar6 = (uint)((long)pcVar3 <
                              result.m_base_fees.super__Optional_base<long,_true,_true>._M_payload.
                              super__Optional_payload_base<long>._M_payload._M_value) * 3 +
                        ALREADY_IN_UTXO_SET;
              }
              else {
                TVar6 = HandleATMPError(&result.m_state,(string *)err_string_out._M_pi);
                bVar11 = false;
              }
              MempoolAcceptResult::~MempoolAcceptResult(&result);
              if (!bVar11) {
                bVar5 = false;
                bVar11 = false;
                goto LAB_007bbed3;
              }
            }
            ChainstateManager::ProcessTransaction
                      (&result,(node->chainman)._M_t.
                               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                               .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                       (CTransactionRef *)tx_00,false);
            bVar11 = result.m_result_type == VALID;
            if (bVar11) {
              if ((char)uVar8 != '\0') {
                CTxMemPool::AddUnbroadcastTx
                          ((node->mempool)._M_t.
                           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,&txid.m_wrapped);
              }
              if (((char)uVar9 == '\0') ||
                 (this = (node->validation_signals)._M_t.
                         super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                         .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl,
                 this == (ValidationSignals *)0x0)) goto LAB_007bbec6;
              func.super__Function_base._M_functor._4_4_ = uVar9;
              func.super__Function_base._M_functor._0_4_ = uVar8;
              func.super__Function_base._M_functor._8_8_ = err_string_out._M_pi;
              func.super__Function_base._M_manager = (_Manager_type)err_string;
              func._M_invoker = (_Invoker_type)&promise;
              ValidationSignals::CallFunctionInValidationInterfaceQueue(this,func);
              std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe50);
              bVar5 = true;
            }
            else {
              TVar6 = HandleATMPError(&result.m_state,(string *)err_string_out._M_pi);
LAB_007bbec6:
              bVar5 = false;
            }
            MempoolAcceptResult::~MempoolAcceptResult(&result);
          }
          else {
            wtxid.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)
                  ((mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            wtxid.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)
                  (((mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            wtxid.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)
                  (((mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)
            ;
            wtxid.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)
                  (((mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18)
            ;
            TVar6 = ALREADY_IN_UTXO_SET;
            bVar11 = true;
            bVar5 = false;
          }
LAB_007bbed3:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&mempool_tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          goto LAB_007bbedd;
        }
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_;
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _0_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _1_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _2_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _3_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _4_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _5_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _6_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
        _7_1_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
        result._0_8_ = txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
        result.m_state.super_ValidationState<TxValidationResult>._0_8_ =
             txid.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_;
        result.m_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity._0_4_ = (undefined4)uVar10;
        pCVar7 = CCoinsViewCache::AccessCoin(this_01,(COutPoint *)&result);
        uVar10 = uVar10 + 1;
      } while ((pCVar7->out).nValue == -1);
      bVar5 = false;
      bVar11 = false;
      TVar6 = ALREADY_IN_UTXO_SET;
LAB_007bbedd:
      cVar12 = (char)uVar8;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock18.super_unique_lock);
      if (bVar11) {
        if (bVar5) {
          __state = &promise;
          std::__basic_future<void>::__basic_future
                    ((__basic_future<void> *)&result,&__state->_M_future);
          std::__basic_future<void>::wait((__basic_future<void> *)&result,__state);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result.m_state);
        }
        TVar6 = OK;
        if (cVar12 != '\0') {
          pPVar4 = (node->peerman)._M_t.
                   super___uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_>._M_t.
                   super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
                   super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl;
          (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x10])
                    (pPVar4,&txid,&wtxid);
        }
      }
      std::promise<void>::~promise(&promise);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return TVar6;
      }
LAB_007bc089:
      __stack_chk_fail();
    }
    __assertion = "node.peerman";
    __line = 0x29;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/transaction.cpp"
                ,__line,
                "TransactionError node::BroadcastTransaction(NodeContext &, const CTransactionRef, std::string &, const CAmount &, bool, bool)"
               );
}

Assistant:

TransactionError BroadcastTransaction(NodeContext& node, const CTransactionRef tx, std::string& err_string, const CAmount& max_tx_fee, bool relay, bool wait_callback)
{
    // BroadcastTransaction can be called by RPC or by the wallet.
    // chainman, mempool and peerman are initialized before the RPC server and wallet are started
    // and reset after the RPC sever and wallet are stopped.
    assert(node.chainman);
    assert(node.mempool);
    assert(node.peerman);

    std::promise<void> promise;
    Txid txid = tx->GetHash();
    uint256 wtxid = tx->GetWitnessHash();
    bool callback_set = false;

    {
        LOCK(cs_main);

        // If the transaction is already confirmed in the chain, don't do anything
        // and return early.
        CCoinsViewCache &view = node.chainman->ActiveChainstate().CoinsTip();
        for (size_t o = 0; o < tx->vout.size(); o++) {
            const Coin& existingCoin = view.AccessCoin(COutPoint(txid, o));
            // IsSpent doesn't mean the coin is spent, it means the output doesn't exist.
            // So if the output does exist, then this transaction exists in the chain.
            if (!existingCoin.IsSpent()) return TransactionError::ALREADY_IN_UTXO_SET;
        }

        if (auto mempool_tx = node.mempool->get(txid); mempool_tx) {
            // There's already a transaction in the mempool with this txid. Don't
            // try to submit this transaction to the mempool (since it'll be
            // rejected as a TX_CONFLICT), but do attempt to reannounce the mempool
            // transaction if relay=true.
            //
            // The mempool transaction may have the same or different witness (and
            // wtxid) as this transaction. Use the mempool's wtxid for reannouncement.
            wtxid = mempool_tx->GetWitnessHash();
        } else {
            // Transaction is not already in the mempool.
            if (max_tx_fee > 0) {
                // First, call ATMP with test_accept and check the fee. If ATMP
                // fails here, return error immediately.
                const MempoolAcceptResult result = node.chainman->ProcessTransaction(tx, /*test_accept=*/ true);
                if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
                    return HandleATMPError(result.m_state, err_string);
                } else if (result.m_base_fees.value() > max_tx_fee) {
                    return TransactionError::MAX_FEE_EXCEEDED;
                }
            }
            // Try to submit the transaction to the mempool.
            const MempoolAcceptResult result = node.chainman->ProcessTransaction(tx, /*test_accept=*/ false);
            if (result.m_result_type != MempoolAcceptResult::ResultType::VALID) {
                return HandleATMPError(result.m_state, err_string);
            }

            // Transaction was accepted to the mempool.

            if (relay) {
                // the mempool tracks locally submitted transactions to make a
                // best-effort of initial broadcast
                node.mempool->AddUnbroadcastTx(txid);
            }

            if (wait_callback && node.validation_signals) {
                // For transactions broadcast from outside the wallet, make sure
                // that the wallet has been notified of the transaction before
                // continuing.
                //
                // This prevents a race where a user might call sendrawtransaction
                // with a transaction to/from their wallet, immediately call some
                // wallet RPC, and get a stale result because callbacks have not
                // yet been processed.
                node.validation_signals->CallFunctionInValidationInterfaceQueue([&promise] {
                    promise.set_value();
                });
                callback_set = true;
            }
        }
    } // cs_main

    if (callback_set) {
        // Wait until Validation Interface clients have been notified of the
        // transaction entering the mempool.
        promise.get_future().wait();
    }

    if (relay) {
        node.peerman->RelayTransaction(txid, wtxid);
    }

    return TransactionError::OK;
}